

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.h
# Opt level: O0

void LZ4_renormDictT(LZ4_stream_t_internal *LZ4_dict,BYTE *src)

{
  uint uVar1;
  uint8_t *puVar2;
  uint uVar3;
  int local_2c;
  int i;
  BYTE *dictEnd;
  U32 delta;
  BYTE *src_local;
  LZ4_stream_t_internal *LZ4_dict_local;
  
  if ((0x80000000 < LZ4_dict->currentOffset) || (src < (BYTE *)(ulong)LZ4_dict->currentOffset)) {
    uVar3 = LZ4_dict->currentOffset - 0x10000;
    puVar2 = LZ4_dict->dictionary;
    uVar1 = LZ4_dict->dictSize;
    for (local_2c = 0; local_2c < 0x1000; local_2c = local_2c + 1) {
      if (LZ4_dict->hashTable[local_2c] < uVar3) {
        LZ4_dict->hashTable[local_2c] = 0;
      }
      else {
        LZ4_dict->hashTable[local_2c] = LZ4_dict->hashTable[local_2c] - uVar3;
      }
    }
    LZ4_dict->currentOffset = 0x10000;
    if (0x10000 < LZ4_dict->dictSize) {
      LZ4_dict->dictSize = 0x10000;
    }
    LZ4_dict->dictionary = puVar2 + ((ulong)uVar1 - (ulong)LZ4_dict->dictSize);
  }
  return;
}

Assistant:

static void LZ4_renormDictT(LZ4_stream_t_internal* LZ4_dict, const BYTE* src)
{
    if ((LZ4_dict->currentOffset > 0x80000000) ||
        ((uptrval)LZ4_dict->currentOffset > (uptrval)src)) {   /* address space overflow */
        /* rescale hash table */
        U32 const delta = LZ4_dict->currentOffset - 64 KB;
        const BYTE* dictEnd = LZ4_dict->dictionary + LZ4_dict->dictSize;
        int i;
        for (i=0; i<LZ4_HASH_SIZE_U32; i++) {
            if (LZ4_dict->hashTable[i] < delta) LZ4_dict->hashTable[i]=0;
            else LZ4_dict->hashTable[i] -= delta;
        }
        LZ4_dict->currentOffset = 64 KB;
        if (LZ4_dict->dictSize > 64 KB) LZ4_dict->dictSize = 64 KB;
        LZ4_dict->dictionary = dictEnd - LZ4_dict->dictSize;
    }
}